

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::DebugNodeWindow(ImGuiWindow *window,char *label)

{
  bool bVar1;
  ImVec4 *col;
  char *pcVar2;
  ImDrawList *pIVar3;
  ImGuiOldColumns *columns;
  char *pcVar4;
  char *pcVar5;
  ImVec2 *lhs;
  char *pcVar6;
  char *pcVar7;
  char *pcVar8;
  char *pcVar9;
  char *pcVar10;
  char *pcVar11;
  ImGuiDockNode *local_c0;
  uint local_b8;
  uint local_b4;
  char *local_b0;
  uint local_98;
  int local_78;
  ImVec2 IStack_74;
  int n;
  ImVec2 local_6c;
  ImVec2 local_64;
  ImRect r;
  int layer;
  ImGuiWindowFlags flags;
  byte local_41;
  uint local_40;
  bool open;
  ImGuiTreeNodeFlags tree_node_flags;
  bool is_active;
  ImGuiContext *g;
  char *label_local;
  ImGuiWindow *window_local;
  
  g = (ImGuiContext *)label;
  label_local = (char *)window;
  if (window == (ImGuiWindow *)0x0) {
    BulletText("%s: NULL",label);
  }
  else {
    _tree_node_flags = GImGui;
    open = (bool)(window->WasActive & 1);
    local_40 = (uint)(window == GImGui->NavWindow);
    if (open == false) {
      col = GetStyleColorVec4(1);
      PushStyleColor(0,col);
    }
    pcVar7 = " *Inactive*";
    if ((open & 1U) != 0) {
      pcVar7 = "";
    }
    local_41 = TreeNodeEx(&g->Initialized,local_40,"%s \'%s\'%s",g,*(undefined8 *)label_local,pcVar7
                         );
    if ((open & 1U) == 0) {
      PopStyleColor(1);
    }
    bVar1 = IsItemHovered(0);
    if ((bVar1) && ((open & 1U) != 0)) {
      pIVar3 = GetForegroundDrawList((ImGuiWindow *)label_local);
      lhs = (ImVec2 *)(label_local + 0x48);
      _layer = operator+(lhs,(ImVec2 *)(label_local + 0x50));
      ImDrawList::AddRect(pIVar3,lhs,(ImVec2 *)&layer,0xff00ffff,0.0,0,1.0);
    }
    if ((local_41 & 1) != 0) {
      if ((label_local[0x3e0] & 1U) != 0) {
        TextDisabled("Note: some memory buffers have been compacted/freed.");
      }
      r.Max.y = *(float *)(label_local + 0xc);
      DebugNodeDrawList((ImGuiWindow *)label_local,*(ImGuiViewportP **)(label_local + 0x30),
                        *(ImDrawList **)(label_local + 0x2a8),"DrawList");
      BulletText("Pos: (%.1f,%.1f), Size: (%.1f,%.1f), ContentSize (%.1f,%.1f) Ideal (%.1f,%.1f)",
                 (double)*(float *)(label_local + 0x48),(double)*(float *)(label_local + 0x4c),
                 (double)*(float *)(label_local + 0x50),(double)*(float *)(label_local + 0x54),
                 (double)*(float *)(label_local + 0x60),(double)*(float *)(label_local + 100),
                 (double)*(float *)(label_local + 0x68),(double)*(float *)(label_local + 0x6c));
      pcVar7 = "";
      if (((uint)r.Max.y & 0x1000000) != 0) {
        pcVar7 = "Child ";
      }
      pcVar4 = "";
      if (((uint)r.Max.y & 0x2000000) != 0) {
        pcVar4 = "Tooltip ";
      }
      pcVar6 = "";
      if (((uint)r.Max.y & 0x4000000) != 0) {
        pcVar6 = "Popup ";
      }
      pcVar8 = "";
      if (((uint)r.Max.y & 0x8000000) != 0) {
        pcVar8 = "Modal ";
      }
      pcVar11 = "";
      if (((uint)r.Max.y & 0x10000000) != 0) {
        pcVar11 = "ChildMenu ";
      }
      pcVar5 = "";
      if (((uint)r.Max.y & 0x100) != 0) {
        pcVar5 = "NoSavedSettings ";
      }
      pcVar10 = "";
      if (((uint)r.Max.y & 0x200) != 0) {
        pcVar10 = "NoMouseInputs";
      }
      pcVar9 = "";
      if (((uint)r.Max.y & 0x40000) != 0) {
        pcVar9 = "NoNavInputs";
      }
      pcVar2 = "";
      if (((uint)r.Max.y & 0x40) != 0) {
        pcVar2 = "AlwaysAutoResize";
      }
      BulletText("Flags: 0x%08X (%s%s%s%s%s%s%s%s%s..)",(ulong)(uint)r.Max.y,pcVar7,pcVar4,pcVar6,
                 pcVar8,pcVar11,pcVar5,pcVar10,pcVar9,pcVar2);
      BulletText("WindowClassId: 0x%08X",(ulong)*(uint *)(label_local + 0x14));
      pcVar7 = "";
      if ((label_local[0xc4] & 1U) != 0) {
        pcVar7 = "X";
      }
      pcVar4 = "";
      if ((label_local[0xc5] & 1U) != 0) {
        pcVar4 = "Y";
      }
      BulletText("Scroll: (%.2f/%.2f,%.2f/%.2f) Scrollbar:%s%s",
                 (double)*(float *)(label_local + 0x94),(double)*(float *)(label_local + 0x9c),
                 (double)*(float *)(label_local + 0x98),(double)*(float *)(label_local + 0xa0),
                 pcVar7,pcVar4);
      if (((label_local[199] & 1U) == 0) && ((label_local[200] & 1U) == 0)) {
        local_98 = 0xffffffff;
      }
      else {
        local_98 = (uint)*(short *)(label_local + 0xd6);
      }
      BulletText("Active: %d/%d, WriteAccessed: %d, BeginOrderWithinContext: %d",
                 (ulong)(label_local[199] & 1),(ulong)(label_local[200] & 1),
                 (ulong)(label_local[0xc9] & 1),(ulong)local_98);
      BulletText("Appearing: %d, Hidden: %d (CanSkip %d Cannot %d), SkipItems: %d",
                 (ulong)(label_local[0xcd] & 1),(ulong)(label_local[0xce] & 1),
                 (ulong)(uint)(int)label_local[0xe8],(ulong)(uint)(int)label_local[0xe9],
                 (ulong)(label_local[0xcc] & 1),pcVar11,pcVar5,pcVar10,pcVar9,pcVar2);
      for (r.Max.x = 0.0; (int)r.Max.x < 2; r.Max.x = (float)((int)r.Max.x + 1)) {
        local_64 = *(ImVec2 *)(label_local + (long)(int)r.Max.x * 0x10 + 0x3b8);
        r.Min = ((ImVec2 *)(label_local + (long)(int)r.Max.x * 0x10 + 0x3b8))[1];
        if ((local_64.x < r.Min.y) || (local_64.y < r.Min.y)) {
          BulletText("NavLastIds[%d]: 0x%08X at +(%.1f,%.1f)(%.1f,%.1f)",(double)local_64.x,
                     (double)local_64.y,(double)r.Min.x,(double)r.Min.y,(ulong)(uint)r.Max.x,
                     (ulong)*(uint *)(label_local + (long)(int)r.Max.x * 4 + 0x3b0));
          bVar1 = IsItemHovered(0);
          if (bVar1) {
            pIVar3 = GetForegroundDrawList((ImGuiWindow *)label_local);
            local_6c = operator+(&local_64,(ImVec2 *)(label_local + 0x48));
            IStack_74 = operator+(&r.Min,(ImVec2 *)(label_local + 0x48));
            ImDrawList::AddRect(pIVar3,&local_6c,&stack0xffffffffffffff8c,0xff00ffff,0.0,0,1.0);
          }
        }
        else {
          BulletText("NavLastIds[%d]: 0x%08X",(ulong)(uint)r.Max.x,
                     (ulong)*(uint *)(label_local + (long)(int)r.Max.x * 4 + 0x3b0));
        }
      }
      if (*(long *)(label_local + 0x3a8) == 0) {
        local_b0 = "NULL";
      }
      else {
        local_b0 = (char *)**(undefined8 **)(label_local + 0x3a8);
      }
      BulletText("NavLayersActiveMask: %X, NavLastChildNavWindow: %s",
                 (ulong)(uint)(int)*(short *)(label_local + 0x160),local_b0);
      if (*(long *)(label_local + 0x30) == 0) {
        local_b4 = 0xffffffff;
      }
      else {
        local_b4 = *(uint *)(*(long *)(label_local + 0x30) + 0x5c);
      }
      pcVar7 = "";
      if ((label_local[0xc6] & 1U) != 0) {
        pcVar7 = " (Owned)";
      }
      BulletText("Viewport: %d%s, ViewportId: 0x%08X, ViewportPos: (%.1f,%.1f)",
                 (double)*(float *)(label_local + 0x3c),(double)*(float *)(label_local + 0x40),
                 (ulong)local_b4,pcVar7,(ulong)*(uint *)(label_local + 0x38));
      if (*(long *)(label_local + 0x30) == 0) {
        local_b8 = 0xffffffff;
      }
      else {
        local_b8 = (uint)*(short *)(*(long *)(label_local + 0x30) + 0x7c);
      }
      BulletText("ViewportMonitor: %d",(ulong)local_b8);
      BulletText("DockId: 0x%04X, DockOrder: %d, Act: %d, Vis: %d",
                 (ulong)*(uint *)(label_local + 0x410),
                 (ulong)(uint)(int)*(short *)(label_local + 0x3e2),(ulong)(label_local[0x3e1] & 1),
                 (ulong)((byte)label_local[0x3e1] >> 2 & 1));
      if ((*(long *)(label_local + 0x400) != 0) || (*(long *)(label_local + 0x408) != 0)) {
        if (*(long *)(label_local + 0x408) == 0) {
          local_c0 = *(ImGuiDockNode **)(label_local + 0x400);
        }
        else {
          local_c0 = *(ImGuiDockNode **)(label_local + 0x408);
        }
        pcVar7 = "DockNode";
        if (*(long *)(label_local + 0x408) != 0) {
          pcVar7 = "DockNodeAsHost";
        }
        DebugNodeDockNode(local_c0,pcVar7);
      }
      if (*(char **)(label_local + 0x380) != label_local) {
        DebugNodeWindow(*(ImGuiWindow **)(label_local + 0x380),"RootWindow");
      }
      if (*(long *)(label_local + 0x390) != *(long *)(label_local + 0x380)) {
        DebugNodeWindow(*(ImGuiWindow **)(label_local + 0x390),"RootWindowDockTree");
      }
      if (*(long *)(label_local + 0x378) != 0) {
        DebugNodeWindow(*(ImGuiWindow **)(label_local + 0x378),"ParentWindow");
      }
      if (0 < *(int *)(label_local + 0x198)) {
        DebugNodeWindowsList((ImVector<ImGuiWindow_*> *)(label_local + 0x198),"ChildWindows");
      }
      if ((0 < *(int *)(label_local + 0x288)) &&
         (bVar1 = TreeNode("Columns","Columns sets (%d)",(ulong)*(uint *)(label_local + 0x288)),
         bVar1)) {
        for (local_78 = 0; local_78 < *(int *)(label_local + 0x288); local_78 = local_78 + 1) {
          columns = ImVector<ImGuiOldColumns>::operator[]
                              ((ImVector<ImGuiOldColumns> *)(label_local + 0x288),local_78);
          DebugNodeColumns(columns);
        }
        TreePop();
      }
      DebugNodeStorage((ImGuiStorage *)(label_local + 0x278),"Storage");
      TreePop();
    }
  }
  return;
}

Assistant:

void ImGui::DebugNodeWindow(ImGuiWindow* window, const char* label)
{
    if (window == NULL)
    {
        BulletText("%s: NULL", label);
        return;
    }

    ImGuiContext& g = *GImGui;
    const bool is_active = window->WasActive;
    ImGuiTreeNodeFlags tree_node_flags = (window == g.NavWindow) ? ImGuiTreeNodeFlags_Selected : ImGuiTreeNodeFlags_None;
    if (!is_active) { PushStyleColor(ImGuiCol_Text, GetStyleColorVec4(ImGuiCol_TextDisabled)); }
    const bool open = TreeNodeEx(label, tree_node_flags, "%s '%s'%s", label, window->Name, is_active ? "" : " *Inactive*");
    if (!is_active) { PopStyleColor(); }
    if (IsItemHovered() && is_active)
        GetForegroundDrawList(window)->AddRect(window->Pos, window->Pos + window->Size, IM_COL32(255, 255, 0, 255));
    if (!open)
        return;

    if (window->MemoryCompacted)
        TextDisabled("Note: some memory buffers have been compacted/freed.");

    ImGuiWindowFlags flags = window->Flags;
    DebugNodeDrawList(window, window->Viewport, window->DrawList, "DrawList");
    BulletText("Pos: (%.1f,%.1f), Size: (%.1f,%.1f), ContentSize (%.1f,%.1f) Ideal (%.1f,%.1f)", window->Pos.x, window->Pos.y, window->Size.x, window->Size.y, window->ContentSize.x, window->ContentSize.y, window->ContentSizeIdeal.x, window->ContentSizeIdeal.y);
    BulletText("Flags: 0x%08X (%s%s%s%s%s%s%s%s%s..)", flags,
        (flags & ImGuiWindowFlags_ChildWindow)  ? "Child " : "",      (flags & ImGuiWindowFlags_Tooltip)     ? "Tooltip "   : "",  (flags & ImGuiWindowFlags_Popup) ? "Popup " : "",
        (flags & ImGuiWindowFlags_Modal)        ? "Modal " : "",      (flags & ImGuiWindowFlags_ChildMenu)   ? "ChildMenu " : "",  (flags & ImGuiWindowFlags_NoSavedSettings) ? "NoSavedSettings " : "",
        (flags & ImGuiWindowFlags_NoMouseInputs)? "NoMouseInputs":"", (flags & ImGuiWindowFlags_NoNavInputs) ? "NoNavInputs" : "", (flags & ImGuiWindowFlags_AlwaysAutoResize) ? "AlwaysAutoResize" : "");
    BulletText("WindowClassId: 0x%08X", window->WindowClass.ClassId);
    BulletText("Scroll: (%.2f/%.2f,%.2f/%.2f) Scrollbar:%s%s", window->Scroll.x, window->ScrollMax.x, window->Scroll.y, window->ScrollMax.y, window->ScrollbarX ? "X" : "", window->ScrollbarY ? "Y" : "");
    BulletText("Active: %d/%d, WriteAccessed: %d, BeginOrderWithinContext: %d", window->Active, window->WasActive, window->WriteAccessed, (window->Active || window->WasActive) ? window->BeginOrderWithinContext : -1);
    BulletText("Appearing: %d, Hidden: %d (CanSkip %d Cannot %d), SkipItems: %d", window->Appearing, window->Hidden, window->HiddenFramesCanSkipItems, window->HiddenFramesCannotSkipItems, window->SkipItems);
    for (int layer = 0; layer < ImGuiNavLayer_COUNT; layer++)
    {
        ImRect r = window->NavRectRel[layer];
        if (r.Min.x >= r.Max.y && r.Min.y >= r.Max.y)
        {
            BulletText("NavLastIds[%d]: 0x%08X", layer, window->NavLastIds[layer]);
            continue;
        }
        BulletText("NavLastIds[%d]: 0x%08X at +(%.1f,%.1f)(%.1f,%.1f)", layer, window->NavLastIds[layer], r.Min.x, r.Min.y, r.Max.x, r.Max.y);
        if (IsItemHovered())
            GetForegroundDrawList(window)->AddRect(r.Min + window->Pos, r.Max + window->Pos, IM_COL32(255, 255, 0, 255));
    }
    BulletText("NavLayersActiveMask: %X, NavLastChildNavWindow: %s", window->DC.NavLayersActiveMask, window->NavLastChildNavWindow ? window->NavLastChildNavWindow->Name : "NULL");

    BulletText("Viewport: %d%s, ViewportId: 0x%08X, ViewportPos: (%.1f,%.1f)", window->Viewport ? window->Viewport->Idx : -1, window->ViewportOwned ? " (Owned)" : "", window->ViewportId, window->ViewportPos.x, window->ViewportPos.y);
    BulletText("ViewportMonitor: %d", window->Viewport ? window->Viewport->PlatformMonitor : -1);
    BulletText("DockId: 0x%04X, DockOrder: %d, Act: %d, Vis: %d", window->DockId, window->DockOrder, window->DockIsActive, window->DockTabIsVisible);
    if (window->DockNode || window->DockNodeAsHost)
        DebugNodeDockNode(window->DockNodeAsHost ? window->DockNodeAsHost : window->DockNode, window->DockNodeAsHost ? "DockNodeAsHost" : "DockNode");

    if (window->RootWindow != window)       { DebugNodeWindow(window->RootWindow, "RootWindow"); }
    if (window->RootWindowDockTree != window->RootWindow) { DebugNodeWindow(window->RootWindowDockTree, "RootWindowDockTree"); }
    if (window->ParentWindow != NULL)       { DebugNodeWindow(window->ParentWindow, "ParentWindow"); }
    if (window->DC.ChildWindows.Size > 0)   { DebugNodeWindowsList(&window->DC.ChildWindows, "ChildWindows"); }
    if (window->ColumnsStorage.Size > 0 && TreeNode("Columns", "Columns sets (%d)", window->ColumnsStorage.Size))
    {
        for (int n = 0; n < window->ColumnsStorage.Size; n++)
            DebugNodeColumns(&window->ColumnsStorage[n]);
        TreePop();
    }
    DebugNodeStorage(&window->StateStorage, "Storage");
    TreePop();
}